

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header_detection.cpp
# Opt level: O0

void __thiscall duckdb::CSVSniffer::DetectHeader(CSVSniffer *this)

{
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  long in_RDI;
  idx_t i_1;
  idx_t i;
  CSVStateMachine *sniffer_state_machine;
  unordered_map<unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_duckdb::vector<duckdb::LogicalType,_true>_>_>_>
  *in_stack_00000478;
  SetColumns *in_stack_00000480;
  CSVStateMachine *in_stack_00000488;
  vector<duckdb::HeaderValue,_true> *in_stack_00000490;
  ClientContext *in_stack_00000498;
  CSVReaderOptions *in_stack_000004b0;
  MultiFileOptions *in_stack_000004b8;
  CSVErrorHandler *in_stack_000004c0;
  value_type *__x;
  shared_ptr<duckdb::CSVBufferManager,_true> *in_stack_ffffffffffffff00;
  CSVSniffer *this_00;
  undefined8 in_stack_ffffffffffffff18;
  LogicalType *in_stack_ffffffffffffff20;
  LogicalType local_78;
  ulong local_60;
  ulong local_30;
  CSVStateMachine *local_10;
  
  unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>::
  operator->((unique_ptr<duckdb::StringValueScanner,_std::default_delete<duckdb::StringValueScanner>,_true>
              *)in_stack_ffffffffffffff00);
  local_10 = BaseScanner::GetStateMachine((BaseScanner *)0x176f463);
  shared_ptr<duckdb::CSVBufferManager,_true>::operator->(in_stack_ffffffffffffff00);
  __x = *(value_type **)(in_RDI + 200);
  this_00 = *(CSVSniffer **)(in_RDI + 0xd0);
  shared_ptr<duckdb::CSVErrorHandler,_true>::operator*
            ((shared_ptr<duckdb::CSVErrorHandler,_true> *)in_stack_ffffffffffffff00);
  DetectHeaderInternal_abi_cxx11_
            (in_stack_00000498,in_stack_00000490,in_stack_00000488,in_stack_00000480,
             in_stack_00000478,in_stack_000004b0,in_stack_000004b8,in_stack_000004c0);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)this_00,
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             *)__x);
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>::
  ~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           *)0x176f558);
  bVar2 = EmptyOrOnlyHeader(this_00);
  if (bVar2) {
    vector<duckdb::LogicalType,_true>::clear((vector<duckdb::LogicalType,_true> *)0x176f582);
    for (local_30 = 0; uVar1 = local_30,
        sVar3 = ::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)(in_RDI + 600)), uVar1 < sVar3; local_30 = local_30 + 1) {
      LogicalType::LogicalType
                (in_stack_ffffffffffffff20,(LogicalTypeId)((ulong)in_stack_ffffffffffffff18 >> 0x38)
                );
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00,__x);
      LogicalType::~LogicalType((LogicalType *)0x176f608);
    }
  }
  for (local_60 = *(ulong *)(in_RDI + 0xa0); uVar1 = local_60,
      sVar3 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(in_RDI + 600)), uVar1 < sVar3; local_60 = local_60 + 1) {
    LogicalType::LogicalType(&local_78,(LogicalTypeId)((ulong)(in_RDI + 0x238) >> 0x38));
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)this_00,__x);
    LogicalType::~LogicalType((LogicalType *)0x176f6da);
  }
  sVar3 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)(in_RDI + 600));
  *(size_type *)(in_RDI + 0xa0) = sVar3;
  return;
}

Assistant:

void CSVSniffer::DetectHeader() {
	auto &sniffer_state_machine = best_candidate->GetStateMachine();
	names = DetectHeaderInternal(buffer_manager->context, best_header_row, sniffer_state_machine, set_columns,
	                             best_sql_types_candidates_per_column_idx, options, file_options, *error_handler);
	if (EmptyOrOnlyHeader()) {
		// This file only contains a header, lets default to the lowest type of all.
		detected_types.clear();
		for (idx_t i = 0; i < names.size(); i++) {
			detected_types.push_back(LogicalType::BOOLEAN);
		}
	}
	for (idx_t i = max_columns_found; i < names.size(); i++) {
		detected_types.push_back(LogicalType::VARCHAR);
	}
	max_columns_found = names.size();
}